

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::UpdatePlatformWindows(void)

{
  ImVec2 *pIVar1;
  float *pfVar2;
  ImGuiViewportFlags *pIVar3;
  uint uVar4;
  _func_void_ImGuiViewport_ptr_ImVec2 *p_Var5;
  ImVec2 IVar6;
  char *data_p;
  _func_void_ImGuiViewport_ptr_float *p_Var7;
  _func_void_ImGuiViewport_ptr *p_Var8;
  bool bVar9;
  ImGuiContext_conflict1 *pIVar10;
  _Bool _Var11;
  ImGuiID IVar12;
  ImGuiWindow *pIVar13;
  ulong uVar14;
  int iVar15;
  ImGuiViewportP_conflict *pIVar16;
  char cVar17;
  long lVar18;
  char *pcVar19;
  float fVar20;
  
  pIVar10 = GImGui;
  iVar15 = GImGui->FrameCountEnded;
  if (iVar15 != GImGui->FrameCount) {
    __assert_fail("g.FrameCountEnded == g.FrameCount && \"Forgot to call Render() or EndFrame() before UpdatePlatformWindows()?\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                  ,0x3043,"void ImGui::UpdatePlatformWindows()");
  }
  if (iVar15 <= GImGui->FrameCountPlatformEnded) {
    __assert_fail("g.FrameCountPlatformEnded < g.FrameCount",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                  ,0x3044,"void ImGui::UpdatePlatformWindows()");
  }
  GImGui->FrameCountPlatformEnded = iVar15;
  if ((pIVar10->ConfigFlagsCurrFrame & 0x400) != 0) {
    uVar4 = (pIVar10->Viewports).Size;
    uVar14 = (ulong)uVar4;
    if (1 < (int)uVar4) {
      lVar18 = 1;
      do {
        pIVar16 = (pIVar10->Viewports).Data[lVar18];
        pIVar13 = pIVar16->Window;
        cVar17 = '\0';
        if ((pIVar13 != (ImGuiWindow *)0x0) && (cVar17 = '\x01', pIVar13->Active == true)) {
          cVar17 = pIVar13->Hidden;
        }
        if (pIVar16->LastFrameActive < pIVar10->FrameCount + -1 || cVar17 != '\0') {
          DestroyPlatformWindow((ImGuiViewportP_conflict1 *)pIVar16);
        }
        else if (((pIVar10->FrameCount <= pIVar16->LastFrameActive) &&
                 (0.0 < (pIVar16->super_ImGuiViewport).Size.x)) &&
                (0.0 < (pIVar16->super_ImGuiViewport).Size.y)) {
          bVar9 = pIVar16->PlatformWindowCreated;
          if (bVar9 == false) {
            (*(pIVar10->PlatformIO).Platform_CreateWindow)(&pIVar16->super_ImGuiViewport);
            p_Var8 = (pIVar10->PlatformIO).Renderer_CreateWindow;
            if (p_Var8 != (_func_void_ImGuiViewport_ptr *)0x0) {
              (*p_Var8)(&pIVar16->super_ImGuiViewport);
            }
            pIVar16->LastNameHash = 0;
            (pIVar16->LastPlatformPos).x = 3.4028235e+38;
            (pIVar16->LastPlatformPos).y = 3.4028235e+38;
            (pIVar16->LastPlatformSize).x = 3.4028235e+38;
            (pIVar16->LastPlatformSize).y = 3.4028235e+38;
            pIVar16->LastRendererSize = (pIVar16->super_ImGuiViewport).Size;
            pIVar16->PlatformWindowCreated = true;
            fVar20 = 3.4028235e+38;
          }
          else {
            fVar20 = (pIVar16->LastPlatformPos).x;
          }
          pIVar1 = &(pIVar16->super_ImGuiViewport).Pos;
          if ((fVar20 != pIVar1->x) || (NAN(fVar20) || NAN(pIVar1->x))) {
LAB_001d98df:
            if ((pIVar16->super_ImGuiViewport).PlatformRequestMove == false) {
              (*(pIVar10->PlatformIO).Platform_SetWindowPos)
                        (&pIVar16->super_ImGuiViewport,(pIVar16->super_ImGuiViewport).Pos);
            }
          }
          else {
            fVar20 = (pIVar16->LastPlatformPos).y;
            pfVar2 = &(pIVar16->super_ImGuiViewport).Pos.y;
            if ((fVar20 != *pfVar2) || (NAN(fVar20) || NAN(*pfVar2))) goto LAB_001d98df;
          }
          fVar20 = (pIVar16->LastPlatformSize).x;
          pIVar1 = &(pIVar16->super_ImGuiViewport).Size;
          if ((fVar20 != pIVar1->x) || (NAN(fVar20) || NAN(pIVar1->x))) {
LAB_001d9914:
            if ((pIVar16->super_ImGuiViewport).PlatformRequestResize == false) {
              (*(pIVar10->PlatformIO).Platform_SetWindowSize)
                        (&pIVar16->super_ImGuiViewport,(pIVar16->super_ImGuiViewport).Size);
            }
          }
          else {
            fVar20 = (pIVar16->LastPlatformSize).y;
            pfVar2 = &(pIVar16->super_ImGuiViewport).Size.y;
            if ((fVar20 != *pfVar2) || (NAN(fVar20) || NAN(*pfVar2))) goto LAB_001d9914;
          }
          fVar20 = (pIVar16->LastRendererSize).x;
          pIVar1 = &(pIVar16->super_ImGuiViewport).Size;
          if ((fVar20 != pIVar1->x) || (NAN(fVar20) || NAN(pIVar1->x))) {
LAB_001d9949:
            p_Var5 = (pIVar10->PlatformIO).Renderer_SetWindowSize;
            if (p_Var5 != (_func_void_ImGuiViewport_ptr_ImVec2 *)0x0) {
              (*p_Var5)(&pIVar16->super_ImGuiViewport,(pIVar16->super_ImGuiViewport).Size);
            }
          }
          else {
            fVar20 = (pIVar16->LastRendererSize).y;
            pfVar2 = &(pIVar16->super_ImGuiViewport).Size.y;
            if ((fVar20 != *pfVar2) || (NAN(fVar20) || NAN(*pfVar2))) goto LAB_001d9949;
          }
          IVar6 = (pIVar16->super_ImGuiViewport).Size;
          pIVar16->LastPlatformPos = (pIVar16->super_ImGuiViewport).Pos;
          pIVar16->LastRendererSize = IVar6;
          pIVar16->LastPlatformSize = IVar6;
          pIVar13 = pIVar16->Window;
          if ((pIVar13->DockNodeAsHost == (ImGuiDockNode *)0x0) ||
             (pIVar13 = (ImGuiWindow *)pIVar13->DockNodeAsHost->VisibleWindow,
             pIVar13 != (ImGuiWindow *)0x0)) {
            data_p = pIVar13->Name;
            for (pcVar19 = data_p; pcVar19 != (char *)0xffffffffffffffff; pcVar19 = pcVar19 + 1) {
              if (*pcVar19 == '#') {
                if (pcVar19[1] == '#') goto LAB_001d99cd;
              }
              else if (*pcVar19 == '\0') goto LAB_001d99cd;
            }
            pcVar19 = (char *)0xffffffffffffffff;
LAB_001d99cd:
            IVar12 = ImHashStr(data_p,(long)pcVar19 - (long)data_p,0);
            if (pIVar16->LastNameHash != IVar12) {
              cVar17 = *pcVar19;
              *pcVar19 = '\0';
              (*(pIVar10->PlatformIO).Platform_SetWindowTitle)(&pIVar16->super_ImGuiViewport,data_p)
              ;
              *pcVar19 = cVar17;
              pIVar16->LastNameHash = IVar12;
            }
          }
          fVar20 = pIVar16->Alpha;
          if (((pIVar16->LastAlpha != fVar20) || (NAN(pIVar16->LastAlpha) || NAN(fVar20))) &&
             (p_Var7 = (pIVar10->PlatformIO).Platform_SetWindowAlpha,
             p_Var7 != (_func_void_ImGuiViewport_ptr_float *)0x0)) {
            (*p_Var7)(&pIVar16->super_ImGuiViewport,fVar20);
            fVar20 = pIVar16->Alpha;
          }
          pIVar16->LastAlpha = fVar20;
          p_Var8 = (pIVar10->PlatformIO).Platform_UpdateWindow;
          if (p_Var8 != (_func_void_ImGuiViewport_ptr *)0x0) {
            (*p_Var8)(&pIVar16->super_ImGuiViewport);
          }
          if (bVar9 == false) {
            if (pIVar10->FrameCount < 3) {
              pIVar3 = &(pIVar16->super_ImGuiViewport).Flags;
              *(byte *)pIVar3 = (byte)*pIVar3 | 0x20;
            }
            (*(pIVar10->PlatformIO).Platform_ShowWindow)(&pIVar16->super_ImGuiViewport);
            if (pIVar16->LastFrontMostStampCount != pIVar10->ViewportFrontMostStampCount) {
              iVar15 = pIVar10->ViewportFrontMostStampCount + 1;
              pIVar10->ViewportFrontMostStampCount = iVar15;
              pIVar16->LastFrontMostStampCount = iVar15;
            }
          }
          (pIVar16->super_ImGuiViewport).PlatformRequestMove = false;
          (pIVar16->super_ImGuiViewport).PlatformRequestResize = false;
          (pIVar16->super_ImGuiViewport).PlatformRequestClose = false;
        }
        lVar18 = lVar18 + 1;
        uVar14 = (ulong)(pIVar10->Viewports).Size;
      } while (lVar18 < (long)uVar14);
    }
    if (0 < (int)uVar14 &&
        (pIVar10->PlatformIO).Platform_GetWindowFocus != (_func__Bool_ImGuiViewport_ptr *)0x0) {
      lVar18 = 1;
      do {
        pIVar16 = (pIVar10->Viewports).Data[lVar18 + -1];
        if (pIVar16->PlatformWindowCreated == true) {
          _Var11 = (*(pIVar10->PlatformIO).Platform_GetWindowFocus)(&pIVar16->super_ImGuiViewport);
          if (!_Var11) {
            pIVar16 = (ImGuiViewportP_conflict *)0x0;
          }
          uVar14 = (ulong)(uint)(pIVar10->Viewports).Size;
        }
        else {
          pIVar16 = (ImGuiViewportP_conflict *)0x0;
        }
      } while ((pIVar16 == (ImGuiViewportP_conflict *)0x0) &&
              (bVar9 = lVar18 < (int)uVar14, lVar18 = lVar18 + 1, bVar9));
      if ((pIVar16 != (ImGuiViewportP_conflict *)0x0) &&
         (IVar12 = (pIVar16->super_ImGuiViewport).ID,
         pIVar10->PlatformLastFocusedViewportId != IVar12)) {
        if (pIVar16->LastFrontMostStampCount != pIVar10->ViewportFrontMostStampCount) {
          iVar15 = pIVar10->ViewportFrontMostStampCount + 1;
          pIVar10->ViewportFrontMostStampCount = iVar15;
          pIVar16->LastFrontMostStampCount = iVar15;
        }
        pIVar10->PlatformLastFocusedViewportId = IVar12;
      }
    }
  }
  return;
}

Assistant:

void ImGui::UpdatePlatformWindows()
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.FrameCountEnded == g.FrameCount && "Forgot to call Render() or EndFrame() before UpdatePlatformWindows()?");
    IM_ASSERT(g.FrameCountPlatformEnded < g.FrameCount);
    g.FrameCountPlatformEnded = g.FrameCount;
    if (!(g.ConfigFlagsCurrFrame & ImGuiConfigFlags_ViewportsEnable))
        return;

    // Create/resize/destroy platform windows to match each active viewport.
    // Skip the main viewport (index 0), which is always fully handled by the application!
    for (int i = 1; i < g.Viewports.Size; i++)
    {
        ImGuiViewportP* viewport = g.Viewports[i];

        // Destroy platform window if the viewport hasn't been submitted or if it is hosting a hidden window
        // (the implicit/fallback Debug##Default window will be registering its viewport then be disabled, causing a dummy DestroyPlatformWindow to be made each frame)
        bool destroy_platform_window = false;
        destroy_platform_window |= (viewport->LastFrameActive < g.FrameCount - 1);
        destroy_platform_window |= (viewport->Window && !IsWindowActiveAndVisible(viewport->Window));
        if (destroy_platform_window)
        {
            DestroyPlatformWindow(viewport);
            continue;
        }

        // New windows that appears directly in a new viewport won't always have a size on their first frame
        if (viewport->LastFrameActive < g.FrameCount || viewport->Size.x <= 0 || viewport->Size.y <= 0)
            continue;

        // Create window
        bool is_new_platform_window = (viewport->PlatformWindowCreated == false);
        if (is_new_platform_window)
        {
            IMGUI_DEBUG_LOG_VIEWPORT("Create Platform Window %08X (%s)\n", viewport->ID, viewport->Window ? viewport->Window->Name : "n/a");
            g.PlatformIO.Platform_CreateWindow(viewport);
            if (g.PlatformIO.Renderer_CreateWindow != NULL)
                g.PlatformIO.Renderer_CreateWindow(viewport);
            viewport->LastNameHash = 0;
            viewport->LastPlatformPos = viewport->LastPlatformSize = ImVec2(FLT_MAX, FLT_MAX); // By clearing those we'll enforce a call to Platform_SetWindowPos/Size below, before Platform_ShowWindow (FIXME: Is that necessary?)
            viewport->LastRendererSize = viewport->Size;                                       // We don't need to call Renderer_SetWindowSize() as it is expected Renderer_CreateWindow() already did it.
            viewport->PlatformWindowCreated = true;
        }

        // Apply Position and Size (from ImGui to Platform/Renderer backends)
        if ((viewport->LastPlatformPos.x != viewport->Pos.x || viewport->LastPlatformPos.y != viewport->Pos.y) && !viewport->PlatformRequestMove)
            g.PlatformIO.Platform_SetWindowPos(viewport, viewport->Pos);
        if ((viewport->LastPlatformSize.x != viewport->Size.x || viewport->LastPlatformSize.y != viewport->Size.y) && !viewport->PlatformRequestResize)
            g.PlatformIO.Platform_SetWindowSize(viewport, viewport->Size);
        if ((viewport->LastRendererSize.x != viewport->Size.x || viewport->LastRendererSize.y != viewport->Size.y) && g.PlatformIO.Renderer_SetWindowSize)
            g.PlatformIO.Renderer_SetWindowSize(viewport, viewport->Size);
        viewport->LastPlatformPos = viewport->Pos;
        viewport->LastPlatformSize = viewport->LastRendererSize = viewport->Size;

        // Update title bar (if it changed)
        if (ImGuiWindow* window_for_title = GetWindowForTitleDisplay(viewport->Window))
        {
            const char* title_begin = window_for_title->Name;
            char* title_end = (char*)(intptr_t)FindRenderedTextEnd(title_begin);
            const ImGuiID title_hash = ImHashStr(title_begin, title_end - title_begin);
            if (viewport->LastNameHash != title_hash)
            {
                char title_end_backup_c = *title_end;
                *title_end = 0; // Cut existing buffer short instead of doing an alloc/free, no small gain.
                g.PlatformIO.Platform_SetWindowTitle(viewport, title_begin);
                *title_end = title_end_backup_c;
                viewport->LastNameHash = title_hash;
            }
        }

        // Update alpha (if it changed)
        if (viewport->LastAlpha != viewport->Alpha && g.PlatformIO.Platform_SetWindowAlpha)
            g.PlatformIO.Platform_SetWindowAlpha(viewport, viewport->Alpha);
        viewport->LastAlpha = viewport->Alpha;

        // Optional, general purpose call to allow the backend to perform general book-keeping even if things haven't changed.
        if (g.PlatformIO.Platform_UpdateWindow)
            g.PlatformIO.Platform_UpdateWindow(viewport);

        if (is_new_platform_window)
        {
            // On startup ensure new platform window don't steal focus (give it a few frames, as nested contents may lead to viewport being created a few frames late)
            if (g.FrameCount < 3)
                viewport->Flags |= ImGuiViewportFlags_NoFocusOnAppearing;

            // Show window
            g.PlatformIO.Platform_ShowWindow(viewport);

            // Even without focus, we assume the window becomes front-most.
            // This is useful for our platform z-order heuristic when io.MouseHoveredViewport is not available.
            if (viewport->LastFrontMostStampCount != g.ViewportFrontMostStampCount)
                viewport->LastFrontMostStampCount = ++g.ViewportFrontMostStampCount;
            }

        // Clear request flags
        viewport->ClearRequestFlags();
    }

    // Update our implicit z-order knowledge of platform windows, which is used when the backend cannot provide io.MouseHoveredViewport.
    // When setting Platform_GetWindowFocus, it is expected that the platform backend can handle calls without crashing if it doesn't have data stored.
    // FIXME-VIEWPORT: We should use this information to also set dear imgui-side focus, allowing us to handle os-level alt+tab.
    if (g.PlatformIO.Platform_GetWindowFocus != NULL)
    {
        ImGuiViewportP* focused_viewport = NULL;
        for (int n = 0; n < g.Viewports.Size && focused_viewport == NULL; n++)
        {
            ImGuiViewportP* viewport = g.Viewports[n];
            if (viewport->PlatformWindowCreated)
                if (g.PlatformIO.Platform_GetWindowFocus(viewport))
                    focused_viewport = viewport;
        }

        // Store a tag so we can infer z-order easily from all our windows
        // We compare PlatformLastFocusedViewportId so newly created viewports with _NoFocusOnAppearing flag
        // will keep the front most stamp instead of losing it back to their parent viewport.
        if (focused_viewport && g.PlatformLastFocusedViewportId != focused_viewport->ID)
        {
            if (focused_viewport->LastFrontMostStampCount != g.ViewportFrontMostStampCount)
                focused_viewport->LastFrontMostStampCount = ++g.ViewportFrontMostStampCount;
            g.PlatformLastFocusedViewportId = focused_viewport->ID;
        }
    }
}